

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O0

int pairsmeta(lua_State *L,char *method,int iszero,lua_CFunction iter)

{
  int iVar1;
  lua_CFunction iter_local;
  int iszero_local;
  char *method_local;
  lua_State *L_local;
  
  iVar1 = luaL_getmetafield(L,1,method);
  if (iVar1 == 0) {
    luaL_checktype(L,1,5);
    lua_pushcclosure(L,iter,0);
    lua_pushvalue(L,1);
    if (iszero == 0) {
      lua_pushnil(L);
    }
    else {
      lua_pushinteger(L,0);
    }
  }
  else {
    lua_pushvalue(L,1);
    lua_callk(L,1,3,0,(lua_CFunction)0x0);
  }
  return 3;
}

Assistant:

static int pairsmeta (lua_State *L, const char *method, int iszero,
                      lua_CFunction iter) {
  if (!luaL_getmetafield(L, 1, method)) {  /* no metamethod? */
    luaL_checktype(L, 1, LUA_TTABLE);  /* argument must be a table */
    lua_pushcfunction(L, iter);  /* will return generator, */
    lua_pushvalue(L, 1);  /* state, */
    if (iszero) lua_pushinteger(L, 0);  /* and initial value */
    else lua_pushnil(L);
  }
  else {
    lua_pushvalue(L, 1);  /* argument 'self' to metamethod */
    lua_call(L, 1, 3);  /* get 3 values from metamethod */
  }
  return 3;
}